

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.hpp
# Opt level: O3

void __thiscall
Lodtalk::MethodDictionary::internalAtPut
          (MethodDictionary *this,VMContext *context,Oop key,Oop value)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  size_t newCapacity;
  ulong uVar5;
  ulong uVar6;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar7;
  OopRef valueRef;
  OopRef keyRef;
  anon_union_8_4_0eb573b0_for_Oop_0 local_58;
  VMContext *local_50;
  anon_union_8_4_0eb573b0_for_Oop_0 local_38;
  VMContext *local_30;
  
  uVar4 = *(ulong *)(this + 8);
  if ((uVar4 & 1) == 0) goto LAB_00133cad;
  if (1 < uVar4) {
    if (((ulong)key.field_0 & 1) == 0) {
      uVar3 = key.field_0._0_4_ & 6;
      if ((uVar3 == 4) || (uVar3 == 2)) {
        uVar3 = (uint)((ulong)key.field_0 >> 3);
      }
      else {
        uVar3 = *(uint *)key.field_0 >> 10;
      }
    }
    else {
      uVar3 = (uint)((ulong)key.field_0 >> 1);
    }
    uVar5 = (ulong)(long)(int)uVar3 % (ulong)((long)uVar4 >> 1);
    lVar1 = *(long *)(this + 0x18);
    uVar6 = uVar5;
    if (lVar1 == 0) {
      __assert_fail("keyValues",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/Collections.hpp"
                    ,0xc1,"Oop *Lodtalk::HashedCollection::getHashTableKeyValues() const");
    }
    do {
      aVar7 = (anon_union_8_4_0eb573b0_for_Oop_0)
              ((anon_union_8_4_0eb573b0_for_Oop_0 *)(lVar1 + 8 + uVar6 * 8))->pointer;
      if ((aVar7.pointer == (uint8_t *)&NilObject) ||
         ((anon_union_8_4_0eb573b0_for_Oop_0)aVar7.pointer == key.field_0)) goto LAB_00133c35;
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)uVar4 >> 1));
    if (uVar5 != 0) {
      uVar6 = 0;
      do {
        aVar7 = (anon_union_8_4_0eb573b0_for_Oop_0)
                ((anon_union_8_4_0eb573b0_for_Oop_0 *)(lVar1 + 8 + uVar6 * 8))->pointer;
        if ((aVar7.pointer == (uint8_t *)&NilObject) ||
           ((anon_union_8_4_0eb573b0_for_Oop_0)aVar7.pointer == key.field_0)) goto LAB_00133c35;
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar5);
    }
  }
  goto LAB_00133b37;
LAB_00133c35:
  if (-1 < (long)uVar6) {
    lVar2 = *(long *)(this + 0x20);
    if (lVar2 == 0) {
      __assert_fail("values",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/Collections.hpp"
                    ,0x172,"Oop *Lodtalk::MethodDictionary::getHashTableValues() const");
    }
    *(anon_union_8_4_0eb573b0_for_Oop_0 *)(lVar1 + 8 + uVar6 * 8) = key.field_0;
    *(anon_union_8_4_0eb573b0_for_Oop_0 *)(lVar2 + 8 + uVar6 * 8) = value.field_0;
    if (aVar7.pointer != (uint8_t *)&NilObject) {
      return;
    }
    lVar1 = *(long *)(this + 0x10);
    *(long *)(this + 0x10) = lVar1 + 2;
    if (lVar1 + 2 <= (*(long *)(this + 8) << 2) / 5) {
      return;
    }
    increaseCapacity(this,context);
    return;
  }
LAB_00133b37:
  local_38 = key.field_0;
  local_30 = context;
  OopRef::registerSelf((OopRef *)&local_38);
  local_58 = value.field_0;
  local_50 = context;
  OopRef::registerSelf((OopRef *)&local_58);
  if ((*(ulong *)(this + 8) & 1) != 0) {
    uVar4 = *(ulong *)(this + 8) & 0xfffffffffffffffe;
    newCapacity = 0x10;
    if (uVar4 != 0) {
      newCapacity = uVar4;
    }
    setCapacity(this,context,newCapacity);
    internalAtPut(this,context,(Oop)local_38,(Oop)local_58);
    OopRef::unregisterSelf((OopRef *)&local_58);
    OopRef::unregisterSelf((OopRef *)&local_38);
    return;
  }
LAB_00133cad:
  __assert_fail("isSmallInteger()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                ,0x200,"SmallIntegerValue Lodtalk::Oop::decodeSmallInteger() const");
}

Assistant:

void internalAtPut(VMContext *context, Oop key, Oop value)
	{
		// If a slot was not found, try to increase the capacity.
		auto position = findKeyPosition(key, identityFunction<Oop>, identityHashOf, identityOopEquals);
		if(position < 0)
		{
            OopRef keyRef(context, key);
            OopRef valueRef(context, value);
			increaseCapacity(context);
            return internalAtPut(context, keyRef.oop, valueRef.oop);
		}

		// Put the key and value.
		auto keyArray = getHashTableKeys();
		auto valueArray = getHashTableValues();
		auto oldKey = keyArray[position];
		keyArray[position] = key;
		valueArray[position] = value;

		// Increase the size.
		if(isNil(oldKey))
			increaseSize(context);
	}